

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-test.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = microatf_tp_main(argc,argv,microatf_tp_add_tcs);
  return iVar1;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, timerfd__many_timers);
	ATF_TP_ADD_TC(tp, timerfd__simple_timer);
	ATF_TP_ADD_TC(tp, timerfd__simple_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__complex_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__reset_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__reenable_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__expire_five);
	ATF_TP_ADD_TC(tp, timerfd__simple_gettime);
	ATF_TP_ADD_TC(tp, timerfd__simple_blocking_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__argument_checks);
	ATF_TP_ADD_TC(tp, timerfd__upgrade_simple_to_complex);
	ATF_TP_ADD_TC(tp, timerfd__absolute_timer);
	ATF_TP_ADD_TC(tp, timerfd__absolute_timer_in_the_past);
	ATF_TP_ADD_TC(tp, timerfd__reset_absolute);
	ATF_TP_ADD_TC(tp, timerfd__periodic_timer_performance);
	ATF_TP_ADD_TC(tp, timerfd__argument_overflow);
	ATF_TP_ADD_TC(tp, timerfd__short_evfilt_timer_timeout);
	ATF_TP_ADD_TC(tp, timerfd__unmodified_errno);
	ATF_TP_ADD_TC(tp, timerfd__reset_to_very_long);

	return atf_no_error();
}